

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkMakeOnePo(Abc_Ntk_t *pNtkInit,int Output,int nRange)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *p_00;
  int local_44;
  int i;
  Abc_Obj_t *pNodePo;
  Vec_Ptr_t *vCosLeft;
  Vec_Ptr_t *vPosLeft;
  Abc_Ntk_t *pNtk;
  int nRange_local;
  int Output_local;
  Abc_Ntk_t *pNtkInit_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtkInit);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkIsNetlist(pNtkInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x675,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtkInit);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtkInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x676,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
  }
  if ((Output < 0) || (iVar1 = Abc_NtkPoNum(pNtkInit), iVar1 <= Output)) {
    printf("PO index is incorrect.\n");
    pNtkInit_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtkInit_local = Abc_NtkDup(pNtkInit);
    iVar1 = Abc_NtkPoNum(pNtkInit_local);
    if (iVar1 != 1) {
      pNtk._0_4_ = nRange;
      if (nRange < 1) {
        pNtk._0_4_ = 1;
      }
      p = Vec_PtrAlloc((int)pNtk);
      for (local_44 = 0; iVar1 = Abc_NtkPoNum(pNtkInit_local), local_44 < iVar1;
          local_44 = local_44 + 1) {
        pAVar2 = Abc_NtkPo(pNtkInit_local,local_44);
        if ((local_44 < Output) || (Output + (int)pNtk <= local_44)) {
          Abc_NtkDeleteObjPo(pAVar2);
        }
        else {
          Vec_PtrPush(p,pAVar2);
        }
      }
      p_00 = Vec_PtrDup(p);
      for (local_44 = Abc_NtkPoNum(pNtkInit_local); iVar1 = Abc_NtkCoNum(pNtkInit_local),
          local_44 < iVar1; local_44 = local_44 + 1) {
        pAVar2 = Abc_NtkCo(pNtkInit_local,local_44);
        Vec_PtrPush(p_00,pAVar2);
      }
      Vec_PtrFree(pNtkInit_local->vPos);
      pNtkInit_local->vPos = p;
      Vec_PtrFree(pNtkInit_local->vCos);
      pNtkInit_local->vCos = p_00;
      iVar1 = Abc_NtkIsStrash(pNtkInit_local);
      if (iVar1 == 0) {
        printf("Run sequential cleanup (\"st; scl\") to get rid of dangling logic.\n");
      }
      else {
        Abc_AigCleanup((Abc_Aig_t *)pNtkInit_local->pManFunc);
        printf("Run sequential cleanup (\"scl\") to get rid of dangling logic.\n");
      }
      iVar1 = Abc_NtkCheck(pNtkInit_local);
      if (iVar1 == 0) {
        fprintf(_stdout,"Abc_NtkMakeComb(): Network check has failed.\n");
      }
    }
  }
  return pNtkInit_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkMakeOnePo( Abc_Ntk_t * pNtkInit, int Output, int nRange )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vPosLeft;
    Vec_Ptr_t * vCosLeft;
    Abc_Obj_t * pNodePo;
    int i;
    assert( !Abc_NtkIsNetlist(pNtkInit) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtkInit) );
    if ( Output < 0 || Output >= Abc_NtkPoNum(pNtkInit) )
    {
        printf( "PO index is incorrect.\n" );
        return NULL;
    }

    pNtk = Abc_NtkDup( pNtkInit );
    if ( Abc_NtkPoNum(pNtk) == 1 )
        return pNtk;

    if ( nRange < 1 )
        nRange = 1;

    // filter POs
    vPosLeft = Vec_PtrAlloc( nRange );
    Abc_NtkForEachPo( pNtk, pNodePo, i )
        if ( i < Output || i >= Output + nRange )
            Abc_NtkDeleteObjPo( pNodePo );
        else
            Vec_PtrPush( vPosLeft, pNodePo );
    // filter COs
    vCosLeft = Vec_PtrDup( vPosLeft );
    for ( i = Abc_NtkPoNum(pNtk); i < Abc_NtkCoNum(pNtk); i++ )
        Vec_PtrPush( vCosLeft, Abc_NtkCo(pNtk, i) );
    // update arrays
    Vec_PtrFree( pNtk->vPos );  pNtk->vPos = vPosLeft;
    Vec_PtrFree( pNtk->vCos );  pNtk->vCos = vCosLeft;

    // clean the network
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
        printf( "Run sequential cleanup (\"scl\") to get rid of dangling logic.\n" );
    }
    else
    {
        printf( "Run sequential cleanup (\"st; scl\") to get rid of dangling logic.\n" );
    }

    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkMakeComb(): Network check has failed.\n" );
    return pNtk;
}